

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O3

int celero::Random(void)

{
  result_type_conflict1 rVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  
  if (Random()::rd == '\0') {
    iVar2 = __cxa_guard_acquire(&Random()::rd);
    if (iVar2 != 0) {
      std::random_device::random_device(&Random::rd);
      __cxa_atexit(std::random_device::~random_device,&Random::rd,&__dso_handle);
      __cxa_guard_release(&Random()::rd);
    }
  }
  if (Random()::gen == '\0') {
    iVar2 = __cxa_guard_acquire(&Random()::gen);
    if (iVar2 != 0) {
      uVar3 = std::random_device::_M_getval();
      uVar4 = (ulong)uVar3;
      lVar5 = 1;
      Random::gen._M_x[0] = uVar4;
      do {
        uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
        Random::gen._M_x[lVar5] = uVar4;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x270);
      Random::gen._M_p = 0x270;
      __cxa_guard_release(&Random()::gen);
    }
  }
  if (Random()::dis == '\0') {
    Random();
  }
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&Random::dis,&Random::gen,&Random::dis._M_param);
  return rVar1;
}

Assistant:

int celero::Random()
{
	// http://en.cppreference.com/w/cpp/numeric/random/uniform_int_distribution

	// Will be used to obtain a seed for the random number engine
	static std::random_device rd;

	// Standard mersenne_twister_engine seeded with rd()
	static std::mt19937 gen(rd());

	static std::uniform_int_distribution<> dis(std::numeric_limits<int>::lowest(), std::numeric_limits<int>::max());

	return dis(gen);
}